

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

SPIRExpression * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::
allocate<std::__cxx11::string,unsigned_int&,bool>
          (ObjectPool<diligent_spirv_cross::SPIRExpression> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p,uint *p_1,bool *p_2)

{
  uint uVar1;
  SPIRExpression *this_00;
  bool bVar2;
  size_t sVar3;
  SPIRExpression **ppSVar4;
  TypeID local_7c;
  string local_78;
  SPIRExpression *local_58;
  SPIRExpression *ptr;
  uint local_44;
  SPIRExpression *pSStack_40;
  uint i;
  SPIRExpression *ptr_1;
  bool *pbStack_30;
  uint num_objects;
  bool *p_local_2;
  uint *p_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p_local;
  ObjectPool<diligent_spirv_cross::SPIRExpression> *this_local;
  
  pbStack_30 = p_2;
  p_local_2 = (bool *)p_1;
  p_local_1 = (uint *)p;
  p_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  bVar2 = VectorView<diligent_spirv_cross::SPIRExpression_*>::empty
                    (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>);
  if (bVar2) {
    uVar1 = this->start_object_count;
    sVar3 = VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
            ::size(&(this->memory).
                    super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExpression,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>_>
                  );
    ptr_1._4_4_ = uVar1 << ((byte)sVar3 & 0x1f);
    pSStack_40 = (SPIRExpression *)malloc((ulong)ptr_1._4_4_ * 0xf0);
    if (pSStack_40 == (SPIRExpression *)0x0) {
      return (SPIRExpression *)0x0;
    }
    SmallVector<diligent_spirv_cross::SPIRExpression_*,_0UL>::reserve
              (&this->vacants,(ulong)ptr_1._4_4_);
    for (local_44 = 0; local_44 < ptr_1._4_4_; local_44 = local_44 + 1) {
      ptr = pSStack_40 + local_44;
      SmallVector<diligent_spirv_cross::SPIRExpression_*,_0UL>::push_back(&this->vacants,&ptr);
    }
    SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExpression,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>,8ul>
    ::emplace_back<diligent_spirv_cross::SPIRExpression*&>
              ((SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExpression,diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExpression>::MallocDeleter>,8ul>
                *)&this->memory,&stack0xffffffffffffffc0);
  }
  ppSVar4 = VectorView<diligent_spirv_cross::SPIRExpression_*>::back
                      (&(this->vacants).super_VectorView<diligent_spirv_cross::SPIRExpression_*>);
  local_58 = *ppSVar4;
  SmallVector<diligent_spirv_cross::SPIRExpression_*,_0UL>::pop_back(&this->vacants);
  this_00 = local_58;
  ::std::__cxx11::string::string((string *)&local_78,(string *)p_local_1);
  TypedID<(diligent_spirv_cross::Types)1>::TypedID(&local_7c,*(uint32_t *)p_local_2);
  SPIRExpression::SPIRExpression(this_00,&local_78,local_7c,(bool)(*pbStack_30 & 1));
  ::std::__cxx11::string::~string((string *)&local_78);
  return local_58;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}